

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_dehacked.cpp
# Opt level: O3

int D_LoadDehLumps(void)

{
  bool bVar1;
  int iVar2;
  int lumpnum;
  int iVar3;
  int lastlump;
  int local_2c;
  
  local_2c = 0;
  iVar3 = 0;
  iVar2 = FWadCollection::FindLump(&Wads,"DEHACKED",&local_2c,false);
  if (-1 < iVar2) {
    iVar3 = 0;
    do {
      bVar1 = D_LoadDehLump(iVar2);
      iVar3 = iVar3 + (uint)bVar1;
      iVar2 = FWadCollection::FindLump(&Wads,"DEHACKED",&local_2c,false);
    } while (-1 < iVar2);
  }
  iVar2 = dehload.Value;
  if ((PatchSize == 0) && (0 < dehload.Value)) {
    lumpnum = FWadCollection::GetNumLumps(&Wads);
    if (iVar2 == 1) {
      if (0 < lumpnum) {
        iVar2 = 0;
        local_2c = lumpnum;
        do {
          bVar1 = isDehFile(iVar2);
          if (bVar1) {
            bVar1 = D_LoadDehLump(iVar2);
            iVar3 = iVar3 + (uint)bVar1;
          }
          iVar2 = iVar2 + 1;
        } while (iVar2 < local_2c);
      }
    }
    else {
      do {
        if (lumpnum < 1) {
          return iVar3;
        }
        lumpnum = lumpnum + -1;
        bVar1 = isDehFile(lumpnum);
      } while (!bVar1);
      bVar1 = D_LoadDehLump(lumpnum);
      iVar3 = iVar3 + (uint)bVar1;
    }
  }
  return iVar3;
}

Assistant:

int D_LoadDehLumps()
{
	int lastlump = 0, lumpnum, count = 0;

	while ((lumpnum = Wads.FindLump("DEHACKED", &lastlump)) >= 0)
	{
		count += D_LoadDehLump(lumpnum);
	}

	if (0 == PatchSize && dehload > 0)
	{
		// No DEH/BEX patch is loaded yet, try to find lump(s) with specific extensions

		if (dehload == 1)	// load all .DEH lumps that are found.
		{
			for (lumpnum = 0, lastlump = Wads.GetNumLumps(); lumpnum < lastlump; ++lumpnum)
			{
				if (isDehFile(lumpnum))
				{
					count += D_LoadDehLump(lumpnum);
				}
			}
		}
		else 	// only load the last .DEH lump that is found.
		{
			for (lumpnum = Wads.GetNumLumps()-1; lumpnum >=0; --lumpnum)
			{
				if (isDehFile(lumpnum))
				{
					count += D_LoadDehLump(lumpnum);
					break;
				}
			}
		}
	}

	return count;
}